

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int is_mixedcase(char *str)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ushort **ppuVar4;
  int haslower;
  int hasupper;
  size_t c;
  char *str_local;
  
  bVar2 = false;
  bVar1 = false;
  if ((str != (char *)0x0) && (*str != '\0')) {
    for (_haslower = 0; sVar3 = strlen(str), _haslower < sVar3; _haslower = _haslower + 1) {
      if ((!bVar1) && (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)str[_haslower]] & 0x200) != 0)) {
        bVar1 = true;
      }
      if ((!bVar2) && (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)str[_haslower]] & 0x100) != 0)) {
        bVar2 = true;
      }
      if ((bVar1) && (bVar2)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int is_mixedcase(const char * str)
{
   size_t c;
   int hasupper = 0, haslower = 0;

   if( !str || !*str ) return 0;

   for(c = 0; c < strlen(str); c++ ) {
     if( !haslower && islower((int) str[c]) ) haslower = 1;
     if( !hasupper && isupper((int) str[c]) ) hasupper = 1;

      if( haslower && hasupper ) return 1;
   }

   return 0;
}